

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modify_maximal_reconvergence.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ModifyMaximalReconvergence::RemoveMaximalReconvergence
          (ModifyMaximalReconvergence *this)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  Instruction *this_00;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> to_remove;
  
  to_remove.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  to_remove.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  to_remove.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = *(Instruction **)
             ((long)&(((((this->super_Pass).context_)->module_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                     execution_modes_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  bVar1 = false;
  while ((this_00 != (Instruction *)0x0 &&
         ((this_00->opcode_ == OpExecutionModeId || (this_00->opcode_ == OpExecutionMode))))) {
    uVar3 = Instruction::GetSingleWordInOperand(this_00,1);
    if (uVar3 == 0x1787) {
      this_00 = IRContext::KillInst((this->super_Pass).context_,this_00);
      bVar1 = true;
    }
    else {
      this_00 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        this_00 = (Instruction *)0x0;
      }
    }
  }
  bVar2 = IRContext::RemoveExtension((this->super_Pass).context_,kSPV_KHR_maximal_reconvergence);
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&to_remove.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  return bVar1 || bVar2;
}

Assistant:

bool ModifyMaximalReconvergence::RemoveMaximalReconvergence() {
  bool changed = false;
  std::vector<Instruction*> to_remove;
  Instruction* mode = &*get_module()->execution_mode_begin();
  while (mode) {
    if (mode->opcode() != spv::Op::OpExecutionMode &&
        mode->opcode() != spv::Op::OpExecutionModeId) {
      break;
    }
    if (spv::ExecutionMode(mode->GetSingleWordInOperand(1)) ==
        spv::ExecutionMode::MaximallyReconvergesKHR) {
      mode = context()->KillInst(mode);
      changed = true;
    } else {
      mode = mode->NextNode();
    }
  }

  changed |=
      context()->RemoveExtension(Extension::kSPV_KHR_maximal_reconvergence);
  return changed;
}